

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O2

UINT8 nes_r_nsfplay(void *chip,UINT8 offset)

{
  UINT8 UVar1;
  UINT8 readVal;
  UINT8 local_19;
  
  if (offset < 0x20) {
    local_19 = '\0';
    NES_APU_np_Read(chip,offset | 0x4000,&local_19);
    NES_DMC_np_Read(chip,offset | 0x4000,&local_19);
  }
  else {
    if ((*(void **)((long)chip + 0x18) != (void *)0x0) && (*(char *)((long)chip + 0x28) == '\0')) {
      UVar1 = nes_read_fds(*(void **)((long)chip + 0x18),offset);
      return UVar1;
    }
    local_19 = '\0';
  }
  return local_19;
}

Assistant:

static UINT8 nes_r_nsfplay(void* chip, UINT8 offset)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	if (offset < 0x20)	// NES APU
	{
		UINT8 readVal = 0x00;
		
		// the functions OR the result to the value
		NES_APU_np_Read(info, 0x4000 | offset, &readVal);
		NES_DMC_np_Read(info, 0x4000 | offset, &readVal);
		
		return readVal;
	}
	else	// FDS
	{
#ifdef EC_NES_NSFP_FDS
		if (info->chip_fds != NULL && ! info->fds_disable)
			return nes_read_fds(info->chip_fds, offset);
#endif
		return 0x00;
	}
}